

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::forestUpdate(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,int p_col,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *p_work,int num,int *nonz)

{
  uint *puVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  Real RVar7;
  undefined8 uVar8;
  bool bVar9;
  type_conflict5 tVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  SPxStatusException *pSVar14;
  int iVar15;
  long lVar16;
  int *piVar17;
  int *piVar18;
  int *piVar19;
  int iVar20;
  int *piVar21;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_01;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_02;
  int *piVar22;
  int *piVar23;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_03;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_04;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_05;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_06;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_07;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_08;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_09;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_10;
  ulong uVar24;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pCVar25;
  int *piVar26;
  cpp_dec_float<50U,_int,_void> *pcVar27;
  pointer pnVar28;
  cpp_dec_float<50u,int,void> *pcVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  cpp_dec_float<50U,_int,_void> local_5e8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_5b0;
  int *local_5a8;
  int *local_5a0;
  int num_local;
  ulong local_590;
  pointer local_588;
  cpp_dec_float<50u,int,void> *local_580;
  ulong local_578;
  int *local_570;
  pointer local_568;
  int *local_560;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  int local_4f8;
  ulong local_4e8;
  int local_4d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4c8;
  int *local_490;
  ulong local_488;
  int *local_480;
  int *local_478;
  int local_46c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  double local_420;
  multiprecision local_418 [8];
  uint auStack_410 [2];
  uint local_408 [2];
  undefined8 uStack_400;
  undefined8 local_3f8;
  int local_3f0;
  cpp_dec_float<50u,int,void> local_3ec;
  fpclass_type local_3e8;
  int32_t iStack_3e4;
  multiprecision local_3d8 [8];
  uint auStack_3d0 [2];
  uint local_3c8 [2];
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  int local_3b0;
  cpp_dec_float<50u,int,void> local_3ac;
  fpclass_type local_3a8;
  int32_t iStack_3a4;
  multiprecision local_398 [8];
  uint auStack_390 [2];
  uint local_388 [2];
  undefined8 uStack_380;
  undefined8 local_378;
  int local_370;
  cpp_dec_float<50u,int,void> local_36c;
  fpclass_type local_368;
  int32_t iStack_364;
  multiprecision local_358 [8];
  uint auStack_350 [2];
  uint local_348 [2];
  undefined8 uStack_340;
  undefined8 local_338;
  int local_330;
  cpp_dec_float<50u,int,void> local_32c;
  fpclass_type local_328;
  int32_t iStack_324;
  multiprecision local_318 [8];
  uint auStack_310 [2];
  uint local_308 [2];
  undefined8 uStack_300;
  undefined8 local_2f8;
  int local_2f0;
  cpp_dec_float<50u,int,void> local_2ec;
  fpclass_type local_2e8;
  int32_t iStack_2e4;
  multiprecision local_2d8 [8];
  uint auStack_2d0 [2];
  uint local_2c8 [2];
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  int local_2b0;
  cpp_dec_float<50u,int,void> local_2ac;
  fpclass_type local_2a8;
  int32_t iStack_2a4;
  multiprecision local_298 [8];
  uint auStack_290 [2];
  uint local_288 [2];
  undefined8 uStack_280;
  undefined8 local_278;
  int local_270;
  cpp_dec_float<50u,int,void> local_26c;
  fpclass_type local_268;
  int32_t iStack_264;
  multiprecision local_258 [8];
  uint auStack_250 [2];
  uint local_248 [2];
  undefined8 uStack_240;
  undefined8 local_238;
  int local_230;
  cpp_dec_float<50u,int,void> local_22c;
  fpclass_type local_228;
  int32_t iStack_224;
  multiprecision local_218 [8];
  uint auStack_210 [2];
  uint local_208 [2];
  undefined8 uStack_200;
  undefined8 local_1f8;
  int local_1f0;
  cpp_dec_float<50u,int,void> local_1ec;
  fpclass_type local_1e8;
  int32_t iStack_1e4;
  multiprecision local_1d8 [8];
  uint auStack_1d0 [2];
  uint local_1c8 [2];
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  int local_1b0;
  cpp_dec_float<50u,int,void> local_1ac;
  fpclass_type local_1a8;
  int32_t iStack_1a4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_198;
  multiprecision local_158 [8];
  uint auStack_150 [2];
  uint local_148 [2];
  undefined8 uStack_140;
  undefined8 local_138;
  int local_130;
  cpp_dec_float<50u,int,void> local_12c;
  fpclass_type local_128;
  int32_t iStack_124;
  multiprecision local_118 [8];
  uint auStack_110 [2];
  uint local_108 [2];
  undefined8 uStack_100;
  undefined8 local_f8;
  int local_f0;
  cpp_dec_float<50u,int,void> local_ec;
  fpclass_type local_e8;
  int32_t iStack_e4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_5a8 = (int *)CONCAT44(local_5a8._4_4_,num);
  local_5e8.fpclass = cpp_dec_float_finite;
  local_5e8.prec_elem = 10;
  local_5e8.data._M_elems[0] = 0;
  local_5e8.data._M_elems[1] = 0;
  local_5e8.data._M_elems[2] = 0;
  local_5e8.data._M_elems[3] = 0;
  local_5e8.data._M_elems[4] = 0;
  local_5e8.data._M_elems[5] = 0;
  local_5e8.data._M_elems._24_5_ = 0;
  local_5e8.data._M_elems[7]._1_3_ = 0;
  local_5e8.data._M_elems._32_5_ = 0;
  local_5e8.data._M_elems[9]._1_3_ = 0;
  local_5e8.exp = 0;
  local_5e8.neg = false;
  piVar22 = (this->l).start;
  piVar18 = (this->u).col.idx;
  local_490 = (this->u).col.max;
  piVar23 = (this->u).col.len;
  piVar3 = (this->u).col.start;
  pnVar28 = (this->u).row.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  piVar26 = (this->u).row.idx;
  local_478 = (this->u).row.max;
  local_5a0 = (this->u).row.len;
  piVar4 = (this->u).row.start;
  local_480 = (this->row).orig;
  piVar5 = (this->row).perm;
  piVar19 = (this->col).perm;
  piVar6 = (this->col).orig;
  local_4c8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 8);
  local_4c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(this->maxabs).m_backend.data._M_elems;
  local_4c8.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 2);
  local_4c8.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 4);
  local_4c8.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 6);
  local_4c8.m_backend.exp = (this->maxabs).m_backend.exp;
  local_4c8.m_backend.neg = (this->maxabs).m_backend.neg;
  local_4c8.m_backend.fpclass = (this->maxabs).m_backend.fpclass;
  local_4c8.m_backend.prec_elem = (this->maxabs).m_backend.prec_elem;
  local_488 = CONCAT44(local_488._4_4_,this->thedim);
  iVar12 = piVar3[p_col];
  iVar15 = piVar23[p_col];
  this->nzCnt = this->nzCnt - iVar15;
  local_5b0 = this;
  num_local = num;
  local_588 = pnVar28;
  local_580 = (cpp_dec_float<50u,int,void> *)p_work;
  local_560 = nonz;
  for (lVar30 = (long)(iVar15 + iVar12 + -1); pcVar29 = local_580, iVar12 <= lVar30;
      lVar30 = lVar30 + -1) {
    iVar15 = piVar18[lVar30];
    lVar16 = (long)piVar4[iVar15];
    iVar20 = local_5a0[iVar15];
    local_5a0[iVar15] = (int)((long)iVar20 + -1);
    pcVar27 = &pnVar28[lVar16 + -1].m_backend;
    piVar17 = piVar26 + lVar16;
    do {
      piVar21 = piVar17;
      pcVar27 = pcVar27 + 1;
      piVar17 = piVar21 + 1;
    } while (*piVar21 != p_col);
    lVar16 = (long)iVar20 + -1 + lVar16;
    *piVar21 = piVar26[lVar16];
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (pcVar27,&local_588[lVar16].m_backend);
  }
  iVar12 = (int)local_5a8;
  if ((int)local_5a8 == 0) {
    local_570 = (local_5b0->u).col.idx;
    local_568 = (local_5b0->u).col.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_578 = CONCAT44(local_578._4_4_,piVar3[p_col]);
    local_4d8 = local_490[p_col] + piVar3[p_col];
    uVar24 = 0;
    uVar32 = 0;
    if (0 < (int)local_488) {
      uVar32 = local_488 & 0xffffffff;
    }
    local_4e8._0_4_ = (int)local_488;
    local_590 = 0;
    pnVar28 = local_588;
    for (; uVar32 != uVar24; uVar24 = uVar24 + 1) {
      local_5e8.data._M_elems._32_5_ = SUB85(*(undefined8 *)(pcVar29 + 0x20),0);
      local_5e8.data._M_elems[9]._1_3_ =
           (undefined3)((ulong)*(undefined8 *)(pcVar29 + 0x20) >> 0x28);
      local_5e8.data._M_elems._0_8_ = *(undefined8 *)pcVar29;
      local_5e8.data._M_elems._8_8_ = *(undefined8 *)(pcVar29 + 8);
      local_5e8.data._M_elems._16_8_ = *(undefined8 *)(pcVar29 + 0x10);
      local_5e8.data._M_elems._24_5_ = SUB85(*(undefined8 *)(pcVar29 + 0x18),0);
      local_5e8.data._M_elems[7]._1_3_ =
           (undefined3)((ulong)*(undefined8 *)(pcVar29 + 0x18) >> 0x28);
      local_5e8.exp = *(int *)(pcVar29 + 0x28);
      local_5e8.neg = *(bool *)(pcVar29 + 0x2c);
      local_5e8._48_8_ = *(undefined8 *)(pcVar29 + 0x30);
      local_5a8 = piVar26;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(pcVar29,0.0);
      local_198.m_backend.data._M_elems[7]._1_3_ = local_5e8.data._M_elems[7]._1_3_;
      local_198.m_backend.data._M_elems._24_5_ = local_5e8.data._M_elems._24_5_;
      local_198.m_backend.data._M_elems[0] = local_5e8.data._M_elems[0];
      local_198.m_backend.data._M_elems[1] = local_5e8.data._M_elems[1];
      local_198.m_backend.data._M_elems[2] = local_5e8.data._M_elems[2];
      local_198.m_backend.data._M_elems[3] = local_5e8.data._M_elems[3];
      local_198.m_backend.data._M_elems[4] = local_5e8.data._M_elems[4];
      local_198.m_backend.data._M_elems[5] = local_5e8.data._M_elems[5];
      local_198.m_backend.data._M_elems[9]._1_3_ = local_5e8.data._M_elems[9]._1_3_;
      local_198.m_backend.data._M_elems._32_5_ = local_5e8.data._M_elems._32_5_;
      local_198.m_backend.exp = local_5e8.exp;
      local_198.m_backend.neg = local_5e8.neg;
      local_198.m_backend.fpclass = local_5e8.fpclass;
      local_198.m_backend.prec_elem = local_5e8.prec_elem;
      RVar7 = Tolerances::epsilonUpdate
                        ((local_5b0->_tolerances).
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&local_a0,RVar7,(type *)0x0);
      bVar9 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_198,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_a0);
      piVar26 = local_5a8;
      if (bVar9) {
        uStack_1c0 = CONCAT35(local_5e8.data._M_elems[7]._1_3_,local_5e8.data._M_elems._24_5_);
        local_1d8 = (multiprecision  [8])local_5e8.data._M_elems._0_8_;
        auStack_1d0[0] = local_5e8.data._M_elems[2];
        auStack_1d0[1] = local_5e8.data._M_elems[3];
        local_1c8[0] = local_5e8.data._M_elems[4];
        local_1c8[1] = local_5e8.data._M_elems[5];
        local_1b8 = CONCAT35(local_5e8.data._M_elems[9]._1_3_,local_5e8.data._M_elems._32_5_);
        local_1b0 = local_5e8.exp;
        local_1ac = (cpp_dec_float<50u,int,void>)local_5e8.neg;
        local_1a8 = local_5e8.fpclass;
        iStack_1a4 = local_5e8.prec_elem;
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_1,local_1d8,arg_01);
        tVar10 = boost::multiprecision::operator>(&result_1,&local_4c8);
        if (tVar10) {
          uStack_200 = CONCAT35(local_5e8.data._M_elems[7]._1_3_,local_5e8.data._M_elems._24_5_);
          local_218 = (multiprecision  [8])local_5e8.data._M_elems._0_8_;
          auStack_210[0] = local_5e8.data._M_elems[2];
          auStack_210[1] = local_5e8.data._M_elems[3];
          local_208[0] = local_5e8.data._M_elems[4];
          local_208[1] = local_5e8.data._M_elems[5];
          local_1f8 = CONCAT35(local_5e8.data._M_elems[9]._1_3_,local_5e8.data._M_elems._32_5_);
          local_1f0 = local_5e8.exp;
          local_1ec = (cpp_dec_float<50u,int,void>)local_5e8.neg;
          local_1e8 = local_5e8.fpclass;
          iStack_1e4 = local_5e8.prec_elem;
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_1,local_218,arg_02);
          local_4c8.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
          local_4c8.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
          local_4c8.m_backend.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
          local_4c8.m_backend.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
          local_4c8.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
          local_4c8.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
          local_4c8.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
          local_4c8.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
          local_4c8.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
          local_4c8.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
          local_4c8.m_backend.exp = result_1.m_backend.exp;
          local_4c8.m_backend.neg = result_1.m_backend.neg;
          local_4c8.m_backend.fpclass = result_1.m_backend.fpclass;
          local_4c8.m_backend.prec_elem = result_1.m_backend.prec_elem;
        }
        pCVar25 = local_5b0;
        iVar12 = (int)local_578;
        if (local_4d8 <= (int)local_578) {
          piVar23[p_col] = (int)local_578 - piVar3[p_col];
          local_588 = pnVar28;
          forestReMaxCol(local_5b0,p_col,(uint)local_4e8);
          local_570 = (pCVar25->u).col.idx;
          local_568 = (pCVar25->u).col.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          local_4d8 = local_490[p_col] + piVar3[p_col];
          pnVar28 = local_588;
          iVar12 = piVar3[p_col] + piVar23[p_col];
        }
        piVar18 = local_5a0;
        pCVar25 = local_5b0;
        *(ulong *)((long)local_568[iVar12].m_backend.data._M_elems + 0x20) =
             CONCAT35(local_5e8.data._M_elems[9]._1_3_,local_5e8.data._M_elems._32_5_);
        puVar1 = (uint *)((long)local_568[iVar12].m_backend.data._M_elems + 0x10);
        *(undefined8 *)puVar1 = local_5e8.data._M_elems._16_8_;
        *(ulong *)(puVar1 + 2) =
             CONCAT35(local_5e8.data._M_elems[7]._1_3_,local_5e8.data._M_elems._24_5_);
        *(undefined8 *)local_568[iVar12].m_backend.data._M_elems = local_5e8.data._M_elems._0_8_;
        *(undefined8 *)((long)local_568[iVar12].m_backend.data._M_elems + 8) =
             local_5e8.data._M_elems._8_8_;
        local_568[iVar12].m_backend.exp = local_5e8.exp;
        local_568[iVar12].m_backend.neg = local_5e8.neg;
        local_568[iVar12].m_backend.fpclass = local_5e8.fpclass;
        local_568[iVar12].m_backend.prec_elem = local_5e8.prec_elem;
        local_570[iVar12] = (int)uVar24;
        iVar15 = local_5a0[uVar24];
        piVar26 = local_5a8;
        local_578._0_4_ = iVar12;
        if (local_478[uVar24] <= iVar15) {
          remaxRow(local_5b0,(int)uVar24,iVar15 + 1);
          pnVar28 = (pCVar25->u).row.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          piVar26 = (pCVar25->u).row.idx;
          iVar15 = piVar18[uVar24];
        }
        local_578 = CONCAT44(local_578._4_4_,(int)local_578 + 1);
        iVar12 = piVar4[uVar24];
        piVar18[uVar24] = iVar15 + 1;
        lVar30 = (long)iVar15 + (long)iVar12;
        *(ulong *)((long)pnVar28[lVar30].m_backend.data._M_elems + 0x20) =
             CONCAT35(local_5e8.data._M_elems[9]._1_3_,local_5e8.data._M_elems._32_5_);
        puVar1 = (uint *)((long)pnVar28[lVar30].m_backend.data._M_elems + 0x10);
        *(undefined8 *)puVar1 = local_5e8.data._M_elems._16_8_;
        *(ulong *)(puVar1 + 2) =
             CONCAT35(local_5e8.data._M_elems[7]._1_3_,local_5e8.data._M_elems._24_5_);
        *(undefined8 *)pnVar28[lVar30].m_backend.data._M_elems = local_5e8.data._M_elems._0_8_;
        *(undefined8 *)((long)pnVar28[lVar30].m_backend.data._M_elems + 8) =
             local_5e8.data._M_elems._8_8_;
        pnVar28[lVar30].m_backend.exp = local_5e8.exp;
        pnVar28[lVar30].m_backend.neg = local_5e8.neg;
        pnVar28[lVar30].m_backend.fpclass = local_5e8.fpclass;
        pnVar28[lVar30].m_backend.prec_elem = local_5e8.prec_elem;
        piVar26[lVar30] = p_col;
        iVar12 = (int)local_590;
        local_590 = local_590 & 0xffffffff;
        if (iVar12 < piVar5[uVar24]) {
          local_590 = (ulong)(uint)piVar5[uVar24];
        }
      }
      local_4e8._0_4_ = (uint)local_4e8 + -1;
      pcVar29 = pcVar29 + 0x38;
    }
    iVar12 = piVar3[p_col];
    piVar23[p_col] = (int)local_578 - iVar12;
    local_5b0->nzCnt = local_5b0->nzCnt + ((int)local_578 - iVar12);
    if (local_490[p_col] + piVar3[p_col] == (local_5b0->u).col.used) {
      (local_5b0->u).col.used = piVar3[p_col];
      iVar12 = piVar23[p_col];
      local_490[p_col] = iVar12;
      piVar18 = &(local_5b0->u).col.used;
      *piVar18 = *piVar18 + iVar12;
    }
  }
  else {
    piVar23[p_col] = 0;
    if (local_490[p_col] < (int)local_5a8) {
      forestReMaxCol(local_5b0,p_col,(int)local_5a8);
    }
    local_570 = (local_5b0->u).col.idx;
    local_568 = (local_5b0->u).col.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_578 = CONCAT44(local_578._4_4_,piVar3[p_col]);
    local_590 = 0;
    for (lVar30 = 0; lVar30 < iVar12; lVar30 = lVar30 + 1) {
      iVar15 = local_560[lVar30];
      lVar31 = (long)iVar15;
      lVar16 = lVar31 * 0x38;
      local_5e8.data._M_elems._32_5_ = SUB85(*(undefined8 *)(pcVar29 + lVar16 + 0x20),0);
      local_5e8.data._M_elems[9]._1_3_ =
           (undefined3)((ulong)*(undefined8 *)(pcVar29 + lVar16 + 0x20) >> 0x28);
      local_5e8.data._M_elems._0_8_ = *(undefined8 *)(pcVar29 + lVar16);
      local_5e8.data._M_elems._8_8_ = *(undefined8 *)(pcVar29 + lVar16 + 8);
      local_5e8.data._M_elems._16_8_ = *(undefined8 *)(pcVar29 + lVar16 + 0x10);
      uVar8 = *(undefined8 *)(pcVar29 + lVar16 + 0x10 + 8);
      local_5e8.data._M_elems._24_5_ = SUB85(uVar8,0);
      local_5e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
      local_5e8.exp = *(int *)(pcVar29 + lVar16 + 0x28);
      local_5e8.neg = *(bool *)(pcVar29 + lVar16 + 0x2c);
      local_5e8._48_8_ = *(undefined8 *)(pcVar29 + lVar16 + 0x30);
      local_5a8 = piVar26;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(pcVar29 + lVar16,0.0);
      local_d8.m_backend.data._M_elems[7]._1_3_ = local_5e8.data._M_elems[7]._1_3_;
      local_d8.m_backend.data._M_elems._24_5_ = local_5e8.data._M_elems._24_5_;
      local_d8.m_backend.data._M_elems[0] = local_5e8.data._M_elems[0];
      local_d8.m_backend.data._M_elems[1] = local_5e8.data._M_elems[1];
      local_d8.m_backend.data._M_elems[2] = local_5e8.data._M_elems[2];
      local_d8.m_backend.data._M_elems[3] = local_5e8.data._M_elems[3];
      local_d8.m_backend.data._M_elems[4] = local_5e8.data._M_elems[4];
      local_d8.m_backend.data._M_elems[5] = local_5e8.data._M_elems[5];
      local_d8.m_backend.data._M_elems[9]._1_3_ = local_5e8.data._M_elems[9]._1_3_;
      local_d8.m_backend.data._M_elems._32_5_ = local_5e8.data._M_elems._32_5_;
      local_d8.m_backend.exp = local_5e8.exp;
      local_d8.m_backend.neg = local_5e8.neg;
      local_d8.m_backend.fpclass = local_5e8.fpclass;
      local_d8.m_backend.prec_elem = local_5e8.prec_elem;
      RVar7 = Tolerances::epsilonUpdate
                        ((local_5b0->_tolerances).
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&local_68,RVar7,(type *)0x0);
      bVar9 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_d8,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_68);
      piVar26 = local_5a8;
      if (bVar9) {
        uStack_100 = CONCAT35(local_5e8.data._M_elems[7]._1_3_,local_5e8.data._M_elems._24_5_);
        local_118 = (multiprecision  [8])local_5e8.data._M_elems._0_8_;
        auStack_110[0] = local_5e8.data._M_elems[2];
        auStack_110[1] = local_5e8.data._M_elems[3];
        local_108[0] = local_5e8.data._M_elems[4];
        local_108[1] = local_5e8.data._M_elems[5];
        local_f8 = CONCAT35(local_5e8.data._M_elems[9]._1_3_,local_5e8.data._M_elems._32_5_);
        local_f0 = local_5e8.exp;
        local_ec = (cpp_dec_float<50u,int,void>)local_5e8.neg;
        local_e8 = local_5e8.fpclass;
        iStack_e4 = local_5e8.prec_elem;
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_1,local_118,arg);
        tVar10 = boost::multiprecision::operator>(&result_1,&local_4c8);
        if (tVar10) {
          uStack_140 = CONCAT35(local_5e8.data._M_elems[7]._1_3_,local_5e8.data._M_elems._24_5_);
          local_158 = (multiprecision  [8])local_5e8.data._M_elems._0_8_;
          auStack_150[0] = local_5e8.data._M_elems[2];
          auStack_150[1] = local_5e8.data._M_elems[3];
          local_148[0] = local_5e8.data._M_elems[4];
          local_148[1] = local_5e8.data._M_elems[5];
          local_138 = CONCAT35(local_5e8.data._M_elems[9]._1_3_,local_5e8.data._M_elems._32_5_);
          local_130 = local_5e8.exp;
          local_12c = (cpp_dec_float<50u,int,void>)local_5e8.neg;
          local_128 = local_5e8.fpclass;
          iStack_124 = local_5e8.prec_elem;
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_1,local_158,arg_00);
          local_4c8.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
          local_4c8.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
          local_4c8.m_backend.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
          local_4c8.m_backend.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
          local_4c8.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
          local_4c8.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
          local_4c8.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
          local_4c8.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
          local_4c8.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
          local_4c8.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
          local_4c8.m_backend.exp = result_1.m_backend.exp;
          local_4c8.m_backend.neg = result_1.m_backend.neg;
          local_4c8.m_backend.fpclass = result_1.m_backend.fpclass;
          local_4c8.m_backend.prec_elem = result_1.m_backend.prec_elem;
        }
        piVar18 = local_5a0;
        pCVar25 = local_5b0;
        lVar16 = (long)(int)local_578;
        *(ulong *)((long)local_568[lVar16].m_backend.data._M_elems + 0x20) =
             CONCAT35(local_5e8.data._M_elems[9]._1_3_,local_5e8.data._M_elems._32_5_);
        puVar1 = (uint *)((long)local_568[lVar16].m_backend.data._M_elems + 0x10);
        *(undefined8 *)puVar1 = local_5e8.data._M_elems._16_8_;
        *(ulong *)(puVar1 + 2) =
             CONCAT35(local_5e8.data._M_elems[7]._1_3_,local_5e8.data._M_elems._24_5_);
        *(undefined8 *)local_568[lVar16].m_backend.data._M_elems = local_5e8.data._M_elems._0_8_;
        *(undefined8 *)((long)local_568[lVar16].m_backend.data._M_elems + 8) =
             local_5e8.data._M_elems._8_8_;
        local_568[lVar16].m_backend.exp = local_5e8.exp;
        local_568[lVar16].m_backend.neg = local_5e8.neg;
        local_568[lVar16].m_backend.fpclass = local_5e8.fpclass;
        local_568[lVar16].m_backend.prec_elem = local_5e8.prec_elem;
        local_570[lVar16] = iVar15;
        iVar12 = local_5a0[lVar31];
        piVar26 = local_5a8;
        if (local_478[lVar31] <= iVar12) {
          remaxRow(local_5b0,iVar15,iVar12 + 1);
          local_588 = (pCVar25->u).row.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          iVar12 = piVar18[lVar31];
          piVar26 = (pCVar25->u).row.idx;
          pcVar29 = local_580;
        }
        local_578 = CONCAT44(local_578._4_4_,(int)local_578 + 1);
        iVar15 = piVar4[lVar31];
        piVar18[lVar31] = iVar12 + 1;
        lVar16 = (long)iVar12 + (long)iVar15;
        *(ulong *)((long)local_588[lVar16].m_backend.data._M_elems + 0x20) =
             CONCAT35(local_5e8.data._M_elems[9]._1_3_,local_5e8.data._M_elems._32_5_);
        puVar1 = (uint *)((long)local_588[lVar16].m_backend.data._M_elems + 0x10);
        *(undefined8 *)puVar1 = local_5e8.data._M_elems._16_8_;
        *(ulong *)(puVar1 + 2) =
             CONCAT35(local_5e8.data._M_elems[7]._1_3_,local_5e8.data._M_elems._24_5_);
        *(undefined8 *)local_588[lVar16].m_backend.data._M_elems = local_5e8.data._M_elems._0_8_;
        *(undefined8 *)((long)local_588[lVar16].m_backend.data._M_elems + 8) =
             local_5e8.data._M_elems._8_8_;
        local_588[lVar16].m_backend.exp = local_5e8.exp;
        local_588[lVar16].m_backend.neg = local_5e8.neg;
        local_588[lVar16].m_backend.fpclass = local_5e8.fpclass;
        local_588[lVar16].m_backend.prec_elem = local_5e8.prec_elem;
        piVar26[lVar16] = p_col;
        iVar15 = (int)local_590;
        local_590 = local_590 & 0xffffffff;
        iVar12 = num_local;
        if (iVar15 < piVar5[lVar31]) {
          local_590 = (ulong)(uint)piVar5[lVar31];
        }
      }
    }
    iVar12 = piVar3[p_col];
    piVar23[p_col] = (int)local_578 - iVar12;
    local_5b0->nzCnt = local_5b0->nzCnt + ((int)local_578 - iVar12);
    pnVar28 = local_588;
  }
  piVar17 = local_480;
  uVar24 = local_590;
  piVar18 = local_5a0;
  pCVar25 = local_5b0;
  iVar12 = piVar19[p_col];
  lVar30 = (long)iVar12;
  iVar15 = (int)local_590;
  uVar32 = local_590 & 0xffffffff;
  if (iVar12 < iVar15) {
    iVar20 = local_480[lVar30];
    local_590 = lVar30 + 1;
    uVar11 = iVar15 - iVar12;
    local_5a8 = piVar26;
    local_588 = pnVar28;
    local_578 = uVar32;
    memmove(local_480 + lVar30,local_480 + lVar30 + 1,(ulong)uVar11 * 4);
    piVar17[local_578] = iVar20;
    for (lVar16 = lVar30; lVar16 <= (long)local_578; lVar16 = lVar16 + 1) {
      piVar5[piVar17[lVar16]] = (int)lVar16;
    }
    iVar15 = piVar6[lVar30];
    memmove(piVar6 + lVar30,piVar6 + local_590,(ulong)uVar11 * 4);
    pnVar28 = local_568;
    piVar26 = local_570;
    piVar6[local_578] = iVar15;
    for (lVar16 = lVar30; lVar16 <= (long)local_578; lVar16 = lVar16 + 1) {
      piVar19[piVar6[lVar16]] = (int)lVar16;
    }
    iVar15 = local_480[local_578];
    iVar20 = piVar4[iVar15];
    iVar2 = piVar18[iVar15];
    local_5b0->nzCnt = local_5b0->nzCnt - iVar2;
    local_590 = uVar24;
    if ((double)((int)local_488 - iVar12) * 0.001 <= (double)iVar2) {
      for (lVar16 = (long)(iVar2 + iVar20 + -1); pCVar25 = local_5b0, iVar20 <= lVar16;
          lVar16 = lVar16 + -1) {
        lVar31 = (long)local_5a8[lVar16];
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)(local_580 + lVar31 * 0x38),
                   &local_588[lVar16].m_backend);
        iVar12 = piVar23[lVar31];
        piVar23[lVar31] = iVar12 + -1;
        lVar31 = (long)(iVar12 + -1 + piVar3[lVar31]);
        pcVar27 = &pnVar28[lVar31 + 1].m_backend;
        piVar18 = piVar26 + lVar31 + 1;
        do {
          piVar19 = piVar18 + -1;
          pcVar27 = pcVar27 + -1;
          piVar5 = piVar18 + -1;
          piVar18 = piVar19;
        } while (*piVar5 != iVar15);
        *piVar19 = local_570[lVar31];
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (pcVar27,&local_568[lVar31].m_backend);
      }
      iVar12 = makeLvec(local_5b0,uVar11,iVar15);
      local_560 = (int *)CONCAT44(local_560._4_4_,iVar12);
      pnVar28 = (pCVar25->l).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      piVar18 = (pCVar25->l).idx;
      for (; pcVar29 = local_580, piVar26 = local_5a0, lVar30 < (long)local_578; lVar30 = lVar30 + 1
          ) {
        pcVar27 = (cpp_dec_float<50U,_int,_void> *)(local_580 + (long)piVar6[lVar30] * 0x38);
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        tVar10 = boost::multiprecision::operator!=
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)pcVar27,(double *)&result_1.m_backend);
        if (tVar10) {
          iVar12 = local_480[lVar30];
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems._24_5_ = 0;
          result_1.m_backend.data._M_elems[7]._1_3_ = 0;
          result_1.m_backend.data._M_elems._32_5_ = 0;
          result_1.m_backend.data._M_elems[9]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_1.m_backend,pcVar27,
                     &(pCVar25->diag).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar12].m_backend);
          local_5e8.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
          local_5e8.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
          local_5e8.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
          local_5e8.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
          local_5e8.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
          local_5e8.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
          local_5e8.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
          local_5e8.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
          local_5e8.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
          local_5e8.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
          local_5e8.exp = result_1.m_backend.exp;
          local_5e8.neg = result_1.m_backend.neg;
          local_5e8.fpclass = result_1.m_backend.fpclass;
          local_5e8.prec_elem = result_1.m_backend.prec_elem;
          iVar20 = (int)local_560;
          lVar16 = (long)(int)local_560;
          piVar18[lVar16] = iVar12;
          *(ulong *)((long)pnVar28[lVar16].m_backend.data._M_elems + 0x20) =
               CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,
                        result_1.m_backend.data._M_elems._32_5_);
          puVar1 = (uint *)((long)pnVar28[lVar16].m_backend.data._M_elems + 0x10);
          *(undefined8 *)puVar1 = result_1.m_backend.data._M_elems._16_8_;
          *(ulong *)(puVar1 + 2) =
               CONCAT35(result_1.m_backend.data._M_elems[7]._1_3_,
                        result_1.m_backend.data._M_elems._24_5_);
          *(undefined8 *)pnVar28[lVar16].m_backend.data._M_elems =
               result_1.m_backend.data._M_elems._0_8_;
          *(undefined8 *)((long)pnVar28[lVar16].m_backend.data._M_elems + 8) =
               result_1.m_backend.data._M_elems._8_8_;
          pnVar28[lVar16].m_backend.exp = result_1.m_backend.exp;
          pnVar28[lVar16].m_backend.neg = result_1.m_backend.neg;
          pnVar28[lVar16].m_backend.fpclass = result_1.m_backend.fpclass;
          pnVar28[lVar16].m_backend.prec_elem = result_1.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)pcVar27,0.0);
          uStack_340 = CONCAT35(local_5e8.data._M_elems[7]._1_3_,local_5e8.data._M_elems._24_5_);
          local_358 = (multiprecision  [8])local_5e8.data._M_elems._0_8_;
          auStack_350[0] = local_5e8.data._M_elems[2];
          auStack_350[1] = local_5e8.data._M_elems[3];
          local_348[0] = local_5e8.data._M_elems[4];
          local_348[1] = local_5e8.data._M_elems[5];
          local_338 = CONCAT35(local_5e8.data._M_elems[9]._1_3_,local_5e8.data._M_elems._32_5_);
          local_330 = local_5e8.exp;
          local_32c = (cpp_dec_float<50u,int,void>)local_5e8.neg;
          local_328 = local_5e8.fpclass;
          iStack_324 = local_5e8.prec_elem;
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((type *)&result_1.m_backend,local_358,arg_05);
          tVar10 = boost::multiprecision::operator>
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&result_1.m_backend,&local_4c8);
          if (tVar10) {
            uStack_380 = CONCAT35(local_5e8.data._M_elems[7]._1_3_,local_5e8.data._M_elems._24_5_);
            local_398 = (multiprecision  [8])local_5e8.data._M_elems._0_8_;
            auStack_390[0] = local_5e8.data._M_elems[2];
            auStack_390[1] = local_5e8.data._M_elems[3];
            local_388[0] = local_5e8.data._M_elems[4];
            local_388[1] = local_5e8.data._M_elems[5];
            local_378 = CONCAT35(local_5e8.data._M_elems[9]._1_3_,local_5e8.data._M_elems._32_5_);
            local_370 = local_5e8.exp;
            local_36c = (cpp_dec_float<50u,int,void>)local_5e8.neg;
            local_368 = local_5e8.fpclass;
            iStack_364 = local_5e8.prec_elem;
            boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((type *)&result_1.m_backend,local_398,arg_06);
            local_4c8.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
            local_4c8.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
            local_4c8.m_backend.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
            local_4c8.m_backend.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
            local_4c8.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
            local_4c8.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
            local_4c8.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
            local_4c8.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
            local_4c8.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
            local_4c8.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
            local_4c8.m_backend.exp = result_1.m_backend.exp;
            local_4c8.m_backend.neg = result_1.m_backend.neg;
            local_4c8.m_backend.fpclass = result_1.m_backend.fpclass;
            local_4c8.m_backend.prec_elem = result_1.m_backend.prec_elem;
          }
          local_560 = (int *)CONCAT44(local_560._4_4_,iVar20 + 1);
          lVar31 = (long)piVar4[iVar12];
          lVar16 = local_5a0[iVar12] + lVar31;
          pcVar27 = &local_588[lVar31].m_backend;
          for (; pCVar25 = local_5b0, lVar31 < lVar16; lVar31 = lVar31 + 1) {
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 10;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems._24_5_ = 0;
            result_1.m_backend.data._M_elems[7]._1_3_ = 0;
            result_1.m_backend.data._M_elems._32_5_ = 0;
            result_1.m_backend.data._M_elems[9]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_1.m_backend,&local_5e8,pcVar27);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      ((cpp_dec_float<50U,_int,_void> *)(local_580 + (long)local_5a8[lVar31] * 0x38)
                       ,&result_1.m_backend);
            pcVar27 = pcVar27 + 1;
          }
        }
      }
      iVar12 = (pCVar25->l).firstUnused;
      if (piVar22[(long)iVar12 + -1] == (int)local_560) {
        (pCVar25->l).firstUnused = iVar12 + -1;
      }
      else {
        piVar22[iVar12] = (int)local_560;
      }
      lVar30 = (long)piVar6[local_578] * 0x38;
      local_5e8.data._M_elems._32_5_ = SUB85(*(undefined8 *)(local_580 + lVar30 + 0x20),0);
      local_5e8.data._M_elems[9]._1_3_ =
           (undefined3)((ulong)*(undefined8 *)(local_580 + lVar30 + 0x20) >> 0x28);
      local_5e8.data._M_elems._0_8_ = *(undefined8 *)(local_580 + lVar30);
      local_5e8.data._M_elems._8_8_ = *(undefined8 *)(local_580 + lVar30 + 8);
      local_5e8.data._M_elems._16_8_ = *(undefined8 *)(local_580 + lVar30 + 0x10);
      uVar8 = *(undefined8 *)(local_580 + lVar30 + 0x10 + 8);
      local_5e8.data._M_elems._24_5_ = SUB85(uVar8,0);
      local_5e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
      local_5e8.exp = *(int *)(local_580 + lVar30 + 0x28);
      local_5e8.neg = *(bool *)(local_580 + lVar30 + 0x2c);
      local_5e8._48_8_ = *(undefined8 *)(local_580 + lVar30 + 0x30);
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      tVar10 = boost::multiprecision::operator==
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_5e8,(double *)&result_1);
      if (tVar10) {
        pCVar25->stat = SINGULAR;
        pSVar14 = (SPxStatusException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&result_1,"XFORE02 The loaded matrix is singular",(allocator *)&result)
        ;
        SPxStatusException::SPxStatusException(pSVar14,(string *)&result_1);
        __cxa_throw(pSVar14,&SPxStatusException::typeinfo,SPxException::~SPxException);
      }
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 10;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems._24_5_ = 0;
      result_1.m_backend.data._M_elems[7]._1_3_ = 0;
      result_1.m_backend.data._M_elems._32_5_ = 0;
      result_1.m_backend.data._M_elems[9]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      result.m_backend.data._M_elems[0] = 1;
      result.m_backend.data._M_elems[1] = 0;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                (&result_1.m_backend,(longlong *)&result,&local_5e8);
      pnVar28 = (pCVar25->diag).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)pnVar28[iVar15].m_backend.data._M_elems + 0x20) =
           CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,
                    result_1.m_backend.data._M_elems._32_5_);
      puVar1 = (uint *)((long)pnVar28[iVar15].m_backend.data._M_elems + 0x10);
      *(undefined8 *)puVar1 = result_1.m_backend.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(result_1.m_backend.data._M_elems[7]._1_3_,
                    result_1.m_backend.data._M_elems._24_5_);
      *(undefined8 *)pnVar28[iVar15].m_backend.data._M_elems =
           result_1.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((long)pnVar28[iVar15].m_backend.data._M_elems + 8) =
           result_1.m_backend.data._M_elems._8_8_;
      pnVar28[iVar15].m_backend.exp = result_1.m_backend.exp;
      pnVar28[iVar15].m_backend.neg = result_1.m_backend.neg;
      pnVar28[iVar15].m_backend.fpclass = result_1.m_backend.fpclass;
      pnVar28[iVar15].m_backend.prec_elem = result_1.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(pcVar29 + lVar30,0.0);
      uVar11 = (int)local_590 + 1;
      uVar24 = (ulong)uVar11;
      piVar22 = piVar6 + uVar24;
      iVar12 = 0;
      for (; pCVar25 = local_5b0, (int)uVar11 < (int)local_488; uVar11 = uVar11 + 1) {
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        tVar10 = boost::multiprecision::operator!=
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)(local_580 + (long)*piVar22 * 0x38),(double *)&result_1.m_backend);
        iVar12 = iVar12 + (uint)tVar10;
        piVar22 = piVar22 + 1;
      }
      piVar22 = local_5a8;
      if (local_478[iVar15] < iVar12) {
        piVar26[iVar15] = 0;
        remaxRow(local_5b0,iVar15,iVar12);
        local_588 = (pCVar25->u).row.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        piVar22 = (pCVar25->u).row.idx;
      }
      pCVar25->nzCnt = pCVar25->nzCnt + iVar12;
      local_560 = (int *)CONCAT44(local_560._4_4_,piVar4[iVar15]);
      local_5a8 = piVar6 + uVar24;
      pcVar29 = local_580;
      while( true ) {
        if ((int)local_488 <= (int)uVar24) break;
        iVar12 = *local_5a8;
        lVar30 = (long)iVar12;
        lVar16 = lVar30 * 0x38;
        local_5e8.data._M_elems._32_5_ = SUB85(*(undefined8 *)(pcVar29 + lVar16 + 0x20),0);
        local_5e8.data._M_elems[9]._1_3_ =
             (undefined3)((ulong)*(undefined8 *)(pcVar29 + lVar16 + 0x20) >> 0x28);
        local_5e8.data._M_elems._0_8_ = *(undefined8 *)(pcVar29 + lVar16);
        local_5e8.data._M_elems._8_8_ = *(undefined8 *)(pcVar29 + lVar16 + 8);
        local_5e8.data._M_elems._16_8_ = *(undefined8 *)(pcVar29 + lVar16 + 0x10);
        uVar8 = *(undefined8 *)(pcVar29 + lVar16 + 0x10 + 8);
        local_5e8.data._M_elems._24_5_ = SUB85(uVar8,0);
        local_5e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
        local_5e8.exp = *(int *)(pcVar29 + lVar16 + 0x28);
        local_5e8.neg = *(bool *)(pcVar29 + lVar16 + 0x2c);
        local_5e8._48_8_ = *(undefined8 *)(pcVar29 + lVar16 + 0x30);
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        tVar10 = boost::multiprecision::operator!=
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_5e8,(double *)&result_1);
        if (tVar10) {
          uStack_3c0 = CONCAT35(local_5e8.data._M_elems[7]._1_3_,local_5e8.data._M_elems._24_5_);
          local_3d8 = (multiprecision  [8])local_5e8.data._M_elems._0_8_;
          auStack_3d0[0] = local_5e8.data._M_elems[2];
          auStack_3d0[1] = local_5e8.data._M_elems[3];
          local_3c8[0] = local_5e8.data._M_elems[4];
          local_3c8[1] = local_5e8.data._M_elems[5];
          local_3b8 = CONCAT35(local_5e8.data._M_elems[9]._1_3_,local_5e8.data._M_elems._32_5_);
          local_3b0 = local_5e8.exp;
          local_3ac = (cpp_dec_float<50u,int,void>)local_5e8.neg;
          local_3a8 = local_5e8.fpclass;
          iStack_3a4 = local_5e8.prec_elem;
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_1,local_3d8,arg_07);
          tVar10 = boost::multiprecision::operator>(&result_1,&local_4c8);
          if (tVar10) {
            uStack_400 = CONCAT35(local_5e8.data._M_elems[7]._1_3_,local_5e8.data._M_elems._24_5_);
            local_418 = (multiprecision  [8])local_5e8.data._M_elems._0_8_;
            auStack_410[0] = local_5e8.data._M_elems[2];
            auStack_410[1] = local_5e8.data._M_elems[3];
            local_408[0] = local_5e8.data._M_elems[4];
            local_408[1] = local_5e8.data._M_elems[5];
            local_3f8 = CONCAT35(local_5e8.data._M_elems[9]._1_3_,local_5e8.data._M_elems._32_5_);
            local_3f0 = local_5e8.exp;
            local_3ec = (cpp_dec_float<50u,int,void>)local_5e8.neg;
            local_3e8 = local_5e8.fpclass;
            iStack_3e4 = local_5e8.prec_elem;
            boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_1,local_418,arg_08);
            local_4c8.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
            local_4c8.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
            local_4c8.m_backend.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
            local_4c8.m_backend.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
            local_4c8.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
            local_4c8.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
            local_4c8.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
            local_4c8.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
            local_4c8.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
            local_4c8.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
            local_4c8.m_backend.exp = result_1.m_backend.exp;
            local_4c8.m_backend.neg = result_1.m_backend.neg;
            local_4c8.m_backend.fpclass = result_1.m_backend.fpclass;
            local_4c8.m_backend.prec_elem = result_1.m_backend.prec_elem;
          }
          lVar31 = (long)(int)local_560;
          piVar22[lVar31] = iVar12;
          *(ulong *)((long)local_588[lVar31].m_backend.data._M_elems + 0x20) =
               CONCAT35(local_5e8.data._M_elems[9]._1_3_,local_5e8.data._M_elems._32_5_);
          puVar1 = (uint *)((long)local_588[lVar31].m_backend.data._M_elems + 0x10);
          *(undefined8 *)puVar1 = local_5e8.data._M_elems._16_8_;
          *(ulong *)(puVar1 + 2) =
               CONCAT35(local_5e8.data._M_elems[7]._1_3_,local_5e8.data._M_elems._24_5_);
          *(undefined8 *)local_588[lVar31].m_backend.data._M_elems = local_5e8.data._M_elems._0_8_;
          *(undefined8 *)((long)local_588[lVar31].m_backend.data._M_elems + 8) =
               local_5e8.data._M_elems._8_8_;
          local_588[lVar31].m_backend.exp = local_5e8.exp;
          local_588[lVar31].m_backend.neg = local_5e8.neg;
          local_588[lVar31].m_backend.fpclass = local_5e8.fpclass;
          local_588[lVar31].m_backend.prec_elem = local_5e8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    (pcVar29 + lVar16,0.0);
          pCVar25 = local_5b0;
          iVar20 = piVar23[lVar30];
          if (local_490[lVar30] <= iVar20) {
            forestReMaxCol(local_5b0,iVar12,iVar20 + 1);
            local_570 = (pCVar25->u).col.idx;
            local_568 = (pCVar25->u).col.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            iVar20 = piVar23[lVar30];
          }
          local_560 = (int *)CONCAT44(local_560._4_4_,(int)local_560 + 1);
          lVar16 = (long)iVar20 + (long)piVar3[lVar30];
          *(ulong *)((long)local_568[lVar16].m_backend.data._M_elems + 0x20) =
               CONCAT35(local_5e8.data._M_elems[9]._1_3_,local_5e8.data._M_elems._32_5_);
          puVar1 = (uint *)((long)local_568[lVar16].m_backend.data._M_elems + 0x10);
          *(undefined8 *)puVar1 = local_5e8.data._M_elems._16_8_;
          *(ulong *)(puVar1 + 2) =
               CONCAT35(local_5e8.data._M_elems[7]._1_3_,local_5e8.data._M_elems._24_5_);
          *(undefined8 *)local_568[lVar16].m_backend.data._M_elems = local_5e8.data._M_elems._0_8_;
          *(undefined8 *)((long)local_568[lVar16].m_backend.data._M_elems + 8) =
               local_5e8.data._M_elems._8_8_;
          local_568[lVar16].m_backend.exp = local_5e8.exp;
          local_568[lVar16].m_backend.neg = local_5e8.neg;
          local_568[lVar16].m_backend.fpclass = local_5e8.fpclass;
          local_568[lVar16].m_backend.prec_elem = local_5e8.prec_elem;
          iVar12 = piVar3[lVar30];
          iVar20 = piVar23[lVar30];
          piVar23[lVar30] = iVar20 + 1;
          local_570[(long)iVar12 + (long)iVar20] = iVar15;
          pcVar29 = local_580;
        }
        local_5a8 = local_5a8 + 1;
        uVar24 = (ulong)((int)uVar24 + 1);
        piVar26 = local_5a0;
      }
      piVar26[iVar15] = (int)local_560 - piVar4[iVar15];
    }
    else {
      num_local = 0;
      for (local_4e8 = (ulong)(iVar2 + iVar20 + -1); pCVar25 = local_5b0,
          (long)iVar20 <= (long)local_4e8; local_4e8 = local_4e8 - 1) {
        lVar30 = (long)local_5a8[local_4e8];
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)(local_580 + lVar30 * 0x38),
                   &local_588[local_4e8].m_backend);
        enQueueMin(local_560,&num_local,piVar19[lVar30]);
        iVar12 = piVar23[lVar30];
        piVar23[lVar30] = iVar12 + -1;
        lVar30 = (long)(iVar12 + -1 + piVar3[lVar30]);
        pcVar27 = &pnVar28[lVar30 + 1].m_backend;
        piVar18 = piVar26 + lVar30 + 1;
        do {
          piVar17 = piVar18 + -1;
          pcVar27 = pcVar27 + -1;
          piVar5 = piVar18 + -1;
          piVar18 = piVar17;
        } while (*piVar5 != iVar15);
        *piVar17 = local_570[lVar30];
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (pcVar27,&local_568[lVar30].m_backend);
      }
      iVar12 = makeLvec(local_5b0,uVar11,iVar15);
      pnVar28 = (pCVar25->l).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      piVar18 = (pCVar25->l).idx;
      uVar24 = (long)iVar12;
      while (pcVar29 = local_580, uVar11 = (uint)local_4e8, num_local != 0) {
        uVar13 = deQueueMin(local_560,&num_local);
        local_4e8 = (ulong)uVar13;
        uVar11 = (uint)local_590;
        if (uVar13 == (uint)local_590) break;
        iVar12 = piVar6[(int)uVar13];
        iVar20 = local_480[(int)uVar13];
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems._24_5_ = 0;
        result_1.m_backend.data._M_elems[7]._1_3_ = 0;
        result_1.m_backend.data._M_elems._32_5_ = 0;
        result_1.m_backend.data._M_elems[9]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_1.m_backend,
                   (cpp_dec_float<50U,_int,_void> *)(pcVar29 + (long)iVar12 * 0x38),
                   &(pCVar25->diag).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar20].m_backend);
        local_5e8.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
        local_5e8.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
        local_5e8.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
        local_5e8.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
        local_5e8.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
        local_5e8.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
        local_5e8.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
        local_5e8.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
        local_5e8.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
        local_5e8.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
        local_5e8.exp = result_1.m_backend.exp;
        local_5e8.neg = result_1.m_backend.neg;
        local_5e8.fpclass = result_1.m_backend.fpclass;
        local_5e8.prec_elem = result_1.m_backend.prec_elem;
        piVar18[uVar24] = iVar20;
        *(ulong *)((long)pnVar28[uVar24].m_backend.data._M_elems + 0x20) =
             CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,
                      result_1.m_backend.data._M_elems._32_5_);
        puVar1 = (uint *)((long)pnVar28[uVar24].m_backend.data._M_elems + 0x10);
        *(undefined8 *)puVar1 = result_1.m_backend.data._M_elems._16_8_;
        *(ulong *)(puVar1 + 2) =
             CONCAT35(result_1.m_backend.data._M_elems[7]._1_3_,
                      result_1.m_backend.data._M_elems._24_5_);
        *(undefined8 *)pnVar28[uVar24].m_backend.data._M_elems =
             result_1.m_backend.data._M_elems._0_8_;
        *(undefined8 *)((long)pnVar28[uVar24].m_backend.data._M_elems + 8) =
             result_1.m_backend.data._M_elems._8_8_;
        pnVar28[uVar24].m_backend.exp = result_1.m_backend.exp;
        pnVar28[uVar24].m_backend.neg = result_1.m_backend.neg;
        pnVar28[uVar24].m_backend.fpclass = result_1.m_backend.fpclass;
        pnVar28[uVar24].m_backend.prec_elem = result_1.m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  (pcVar29 + (long)iVar12 * 0x38,0.0);
        uStack_240 = CONCAT35(local_5e8.data._M_elems[7]._1_3_,local_5e8.data._M_elems._24_5_);
        local_258 = (multiprecision  [8])local_5e8.data._M_elems._0_8_;
        auStack_250[0] = local_5e8.data._M_elems[2];
        auStack_250[1] = local_5e8.data._M_elems[3];
        local_248[0] = local_5e8.data._M_elems[4];
        local_248[1] = local_5e8.data._M_elems[5];
        local_238 = CONCAT35(local_5e8.data._M_elems[9]._1_3_,local_5e8.data._M_elems._32_5_);
        local_230 = local_5e8.exp;
        local_22c = (cpp_dec_float<50u,int,void>)local_5e8.neg;
        local_228 = local_5e8.fpclass;
        iStack_224 = local_5e8.prec_elem;
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((type *)&result_1.m_backend,local_258,arg_03);
        tVar10 = boost::multiprecision::operator>
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&result_1.m_backend,&local_4c8);
        if (tVar10) {
          uStack_280 = CONCAT35(local_5e8.data._M_elems[7]._1_3_,local_5e8.data._M_elems._24_5_);
          local_298 = (multiprecision  [8])local_5e8.data._M_elems._0_8_;
          auStack_290[0] = local_5e8.data._M_elems[2];
          auStack_290[1] = local_5e8.data._M_elems[3];
          local_288[0] = local_5e8.data._M_elems[4];
          local_288[1] = local_5e8.data._M_elems[5];
          local_278 = CONCAT35(local_5e8.data._M_elems[9]._1_3_,local_5e8.data._M_elems._32_5_);
          local_270 = local_5e8.exp;
          local_26c = (cpp_dec_float<50u,int,void>)local_5e8.neg;
          local_268 = local_5e8.fpclass;
          iStack_264 = local_5e8.prec_elem;
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((type *)&result_1.m_backend,local_298,arg_04);
          local_4c8.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
          local_4c8.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
          local_4c8.m_backend.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
          local_4c8.m_backend.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
          local_4c8.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
          local_4c8.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
          local_4c8.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
          local_4c8.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
          local_4c8.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
          local_4c8.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
          local_4c8.m_backend.exp = result_1.m_backend.exp;
          local_4c8.m_backend.neg = result_1.m_backend.neg;
          local_4c8.m_backend.fpclass = result_1.m_backend.fpclass;
          local_4c8.m_backend.prec_elem = result_1.m_backend.prec_elem;
        }
        local_488 = uVar24 + 1;
        lVar16 = (long)piVar4[iVar20];
        lVar30 = local_5a0[iVar20] + lVar16;
        pcVar27 = &local_588[lVar16].m_backend;
        for (; pCVar25 = local_5b0, uVar24 = local_488, lVar16 < lVar30; lVar16 = lVar16 + 1) {
          iVar12 = local_5a8[lVar16];
          lVar31 = (long)iVar12 * 0x38;
          result_1.m_backend.data._M_elems._32_5_ =
               SUB85(*(undefined8 *)(local_580 + lVar31 + 0x20),0);
          result_1.m_backend.data._M_elems[9]._1_3_ =
               (undefined3)((ulong)*(undefined8 *)(local_580 + lVar31 + 0x20) >> 0x28);
          result_1.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_580 + lVar31);
          result_1.m_backend.data._M_elems._8_8_ = *(undefined8 *)(local_580 + lVar31 + 8);
          result_1.m_backend.data._M_elems._16_8_ = *(undefined8 *)(local_580 + lVar31 + 0x10);
          uVar8 = *(undefined8 *)(local_580 + lVar31 + 0x10 + 8);
          result_1.m_backend.data._M_elems._24_5_ = SUB85(uVar8,0);
          result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
          result_1.m_backend.exp = *(int *)(local_580 + lVar31 + 0x28);
          result_1.m_backend.neg = *(bool *)(local_580 + lVar31 + 0x2c);
          result_1.m_backend._48_8_ = *(undefined8 *)(local_580 + lVar31 + 0x30);
          result.m_backend.data._M_elems._0_8_ =
               result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
          tVar10 = boost::multiprecision::operator==
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&result_1.m_backend,(int *)&result);
          if (tVar10) {
            enQueueMin(local_560,&num_local,piVar19[iVar12]);
          }
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 10;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems._24_5_ = 0;
          result.m_backend.data._M_elems[7]._1_3_ = 0;
          result.m_backend.data._M_elems._32_5_ = 0;
          result.m_backend.data._M_elems[9]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result.m_backend,&local_5e8,pcVar27);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&result_1.m_backend,&result.m_backend);
          local_46c = 0;
          tVar10 = boost::multiprecision::operator==
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&result_1.m_backend,&local_46c);
          uVar33 = 0xe48e0530;
          uVar34 = 0x2b2bff2e;
          if (!tVar10) {
            uVar33 = 0;
            uVar34 = 0;
          }
          pcVar29 = local_580 + lVar31;
          local_420 = (double)CONCAT44(uVar34,uVar33);
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 10;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems._24_5_ = 0;
          result.m_backend.data._M_elems[7]._1_3_ = 0;
          result.m_backend.data._M_elems._32_5_ = 0;
          result.m_backend.data._M_elems[9]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                    (&result.m_backend,&result_1.m_backend,&local_420);
          *(ulong *)(pcVar29 + 0x20) =
               CONCAT35(result.m_backend.data._M_elems[9]._1_3_,
                        result.m_backend.data._M_elems._32_5_);
          *(undefined8 *)(pcVar29 + 0x10) = result.m_backend.data._M_elems._16_8_;
          *(ulong *)(pcVar29 + 0x18) =
               CONCAT35(result.m_backend.data._M_elems[7]._1_3_,
                        result.m_backend.data._M_elems._24_5_);
          *(undefined8 *)pcVar29 = result.m_backend.data._M_elems._0_8_;
          *(undefined8 *)(pcVar29 + 8) = result.m_backend.data._M_elems._8_8_;
          *(int *)(pcVar29 + 0x28) = result.m_backend.exp;
          pcVar29[0x2c] = (cpp_dec_float<50u,int,void>)result.m_backend.neg;
          *(undefined8 *)(pcVar29 + 0x30) = result.m_backend._48_8_;
          pcVar27 = pcVar27 + 1;
        }
      }
      local_4e8._0_4_ = uVar11;
      piVar18 = local_5a0;
      iVar12 = (pCVar25->l).firstUnused;
      if (piVar22[(long)iVar12 + -1] == (int)uVar24) {
        (pCVar25->l).firstUnused = iVar12 + -1;
      }
      else {
        piVar22[iVar12] = (int)uVar24;
      }
      if ((uint)local_4e8 != (uint)local_590) {
        pCVar25->stat = SINGULAR;
        pSVar14 = (SPxStatusException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&result_1,"XFORE01 The loaded matrix is singular",(allocator *)&result)
        ;
        SPxStatusException::SPxStatusException(pSVar14,(string *)&result_1);
        __cxa_throw(pSVar14,&SPxStatusException::typeinfo,SPxException::~SPxException);
      }
      lVar30 = (long)piVar6[local_578] * 0x38;
      pcVar29 = local_580 + lVar30;
      local_5e8.data._M_elems._32_5_ = SUB85(*(undefined8 *)(local_580 + lVar30 + 0x20),0);
      local_5e8.data._M_elems[9]._1_3_ =
           (undefined3)((ulong)*(undefined8 *)(local_580 + lVar30 + 0x20) >> 0x28);
      local_5e8.data._M_elems._0_8_ = *(undefined8 *)(local_580 + lVar30);
      local_5e8.data._M_elems._8_8_ = *(undefined8 *)(local_580 + lVar30 + 8);
      local_5e8.data._M_elems._16_8_ = *(undefined8 *)(local_580 + lVar30 + 0x10);
      uVar8 = *(undefined8 *)(local_580 + lVar30 + 0x10 + 8);
      local_5e8.data._M_elems._24_5_ = SUB85(uVar8,0);
      local_5e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
      local_5e8.exp = *(int *)(local_580 + lVar30 + 0x28);
      local_5e8.neg = *(bool *)(local_580 + lVar30 + 0x2c);
      local_5e8._48_8_ = *(undefined8 *)(local_580 + lVar30 + 0x30);
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 10;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems._24_5_ = 0;
      result_1.m_backend.data._M_elems[7]._1_3_ = 0;
      result_1.m_backend.data._M_elems._32_5_ = 0;
      result_1.m_backend.data._M_elems[9]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      result.m_backend.data._M_elems[0] = 1;
      result.m_backend.data._M_elems[1] = 0;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                (&result_1.m_backend,(longlong *)&result,&local_5e8);
      pnVar28 = (pCVar25->diag).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)pnVar28[iVar15].m_backend.data._M_elems + 0x20) =
           CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,
                    result_1.m_backend.data._M_elems._32_5_);
      puVar1 = (uint *)((long)pnVar28[iVar15].m_backend.data._M_elems + 0x10);
      *(undefined8 *)puVar1 = result_1.m_backend.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(result_1.m_backend.data._M_elems[7]._1_3_,
                    result_1.m_backend.data._M_elems._24_5_);
      *(undefined8 *)pnVar28[iVar15].m_backend.data._M_elems =
           result_1.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((long)pnVar28[iVar15].m_backend.data._M_elems + 8) =
           result_1.m_backend.data._M_elems._8_8_;
      pnVar28[iVar15].m_backend.exp = result_1.m_backend.exp;
      pnVar28[iVar15].m_backend.neg = result_1.m_backend.neg;
      pnVar28[iVar15].m_backend.fpclass = result_1.m_backend.fpclass;
      pnVar28[iVar15].m_backend.prec_elem = result_1.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(pcVar29,0.0);
      iVar12 = num_local;
      piVar22 = local_5a8;
      if (local_478[iVar15] < num_local) {
        piVar18[iVar15] = 0;
        remaxRow(pCVar25,iVar15,num_local);
        local_588 = (pCVar25->u).row.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        piVar22 = (pCVar25->u).row.idx;
      }
      pCVar25->nzCnt = pCVar25->nzCnt + iVar12;
      local_4f8 = piVar4[iVar15];
      for (local_5a8 = (int *)0x0; pcVar29 = local_580, (long)local_5a8 < (long)iVar12;
          local_5a8 = (int *)((long)local_5a8 + 1)) {
        iVar20 = piVar6[local_560[(long)local_5a8]];
        lVar30 = (long)iVar20;
        lVar16 = lVar30 * 0x38;
        local_5e8.data._M_elems._32_5_ = SUB85(*(undefined8 *)(local_580 + lVar16 + 0x20),0);
        local_5e8.data._M_elems[9]._1_3_ =
             (undefined3)((ulong)*(undefined8 *)(local_580 + lVar16 + 0x20) >> 0x28);
        local_5e8.data._M_elems._0_8_ = *(undefined8 *)(local_580 + lVar16);
        local_5e8.data._M_elems._8_8_ = *(undefined8 *)(local_580 + lVar16 + 8);
        local_5e8.data._M_elems._16_8_ = *(undefined8 *)(local_580 + lVar16 + 0x10);
        uVar8 = *(undefined8 *)(local_580 + lVar16 + 0x10 + 8);
        local_5e8.data._M_elems._24_5_ = SUB85(uVar8,0);
        local_5e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
        local_5e8.exp = *(int *)(local_580 + lVar16 + 0x28);
        local_5e8.neg = *(bool *)(local_580 + lVar16 + 0x2c);
        local_5e8._48_8_ = *(undefined8 *)(local_580 + lVar16 + 0x30);
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        tVar10 = boost::multiprecision::operator!=
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_5e8,(double *)&result_1);
        if (tVar10) {
          uStack_2c0 = CONCAT35(local_5e8.data._M_elems[7]._1_3_,local_5e8.data._M_elems._24_5_);
          local_2d8 = (multiprecision  [8])local_5e8.data._M_elems._0_8_;
          auStack_2d0[0] = local_5e8.data._M_elems[2];
          auStack_2d0[1] = local_5e8.data._M_elems[3];
          local_2c8[0] = local_5e8.data._M_elems[4];
          local_2c8[1] = local_5e8.data._M_elems[5];
          local_2b8 = CONCAT35(local_5e8.data._M_elems[9]._1_3_,local_5e8.data._M_elems._32_5_);
          local_2b0 = local_5e8.exp;
          local_2ac = (cpp_dec_float<50u,int,void>)local_5e8.neg;
          local_2a8 = local_5e8.fpclass;
          iStack_2a4 = local_5e8.prec_elem;
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_1,local_2d8,arg_09);
          tVar10 = boost::multiprecision::operator>(&result_1,&local_4c8);
          if (tVar10) {
            uStack_300 = CONCAT35(local_5e8.data._M_elems[7]._1_3_,local_5e8.data._M_elems._24_5_);
            local_318 = (multiprecision  [8])local_5e8.data._M_elems._0_8_;
            auStack_310[0] = local_5e8.data._M_elems[2];
            auStack_310[1] = local_5e8.data._M_elems[3];
            local_308[0] = local_5e8.data._M_elems[4];
            local_308[1] = local_5e8.data._M_elems[5];
            local_2f8 = CONCAT35(local_5e8.data._M_elems[9]._1_3_,local_5e8.data._M_elems._32_5_);
            local_2f0 = local_5e8.exp;
            local_2ec = (cpp_dec_float<50u,int,void>)local_5e8.neg;
            local_2e8 = local_5e8.fpclass;
            iStack_2e4 = local_5e8.prec_elem;
            boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_1,local_318,arg_10);
            local_4c8.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
            local_4c8.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
            local_4c8.m_backend.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
            local_4c8.m_backend.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
            local_4c8.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
            local_4c8.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
            local_4c8.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
            local_4c8.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
            local_4c8.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
            local_4c8.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
            local_4c8.m_backend.exp = result_1.m_backend.exp;
            local_4c8.m_backend.neg = result_1.m_backend.neg;
            local_4c8.m_backend.fpclass = result_1.m_backend.fpclass;
            local_4c8.m_backend.prec_elem = result_1.m_backend.prec_elem;
          }
          lVar31 = (long)local_4f8;
          piVar22[lVar31] = iVar20;
          *(ulong *)((long)local_588[lVar31].m_backend.data._M_elems + 0x20) =
               CONCAT35(local_5e8.data._M_elems[9]._1_3_,local_5e8.data._M_elems._32_5_);
          puVar1 = (uint *)((long)local_588[lVar31].m_backend.data._M_elems + 0x10);
          *(undefined8 *)puVar1 = local_5e8.data._M_elems._16_8_;
          *(ulong *)(puVar1 + 2) =
               CONCAT35(local_5e8.data._M_elems[7]._1_3_,local_5e8.data._M_elems._24_5_);
          *(undefined8 *)local_588[lVar31].m_backend.data._M_elems = local_5e8.data._M_elems._0_8_;
          *(undefined8 *)((long)local_588[lVar31].m_backend.data._M_elems + 8) =
               local_5e8.data._M_elems._8_8_;
          local_588[lVar31].m_backend.exp = local_5e8.exp;
          local_588[lVar31].m_backend.neg = local_5e8.neg;
          local_588[lVar31].m_backend.fpclass = local_5e8.fpclass;
          local_588[lVar31].m_backend.prec_elem = local_5e8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    (pcVar29 + lVar16,0.0);
          pCVar25 = local_5b0;
          iVar12 = piVar23[lVar30];
          if (local_490[lVar30] <= iVar12) {
            forestReMaxCol(local_5b0,iVar20,iVar12 + 1);
            local_570 = (pCVar25->u).col.idx;
            local_568 = (pCVar25->u).col.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            iVar12 = piVar23[lVar30];
          }
          local_4f8 = local_4f8 + 1;
          lVar16 = (long)iVar12 + (long)piVar3[lVar30];
          *(ulong *)((long)local_568[lVar16].m_backend.data._M_elems + 0x20) =
               CONCAT35(local_5e8.data._M_elems[9]._1_3_,local_5e8.data._M_elems._32_5_);
          puVar1 = (uint *)((long)local_568[lVar16].m_backend.data._M_elems + 0x10);
          *(undefined8 *)puVar1 = local_5e8.data._M_elems._16_8_;
          *(ulong *)(puVar1 + 2) =
               CONCAT35(local_5e8.data._M_elems[7]._1_3_,local_5e8.data._M_elems._24_5_);
          *(undefined8 *)local_568[lVar16].m_backend.data._M_elems = local_5e8.data._M_elems._0_8_;
          *(undefined8 *)((long)local_568[lVar16].m_backend.data._M_elems + 8) =
               local_5e8.data._M_elems._8_8_;
          local_568[lVar16].m_backend.exp = local_5e8.exp;
          local_568[lVar16].m_backend.neg = local_5e8.neg;
          local_568[lVar16].m_backend.fpclass = local_5e8.fpclass;
          local_568[lVar16].m_backend.prec_elem = local_5e8.prec_elem;
          iVar12 = piVar3[lVar30];
          iVar20 = piVar23[lVar30];
          piVar23[lVar30] = iVar20 + 1;
          local_570[(long)iVar12 + (long)iVar20] = iVar15;
          iVar12 = num_local;
        }
        piVar18 = local_5a0;
      }
      piVar18[iVar15] = local_4f8 - piVar4[iVar15];
    }
  }
  else {
    if (iVar15 != iVar12) {
      local_5b0->stat = SINGULAR;
      pSVar14 = (SPxStatusException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&result_1,"XFORE03 The loaded matrix is singular",(allocator *)&result);
      SPxStatusException::SPxStatusException(pSVar14,(string *)&result_1);
      __cxa_throw(pSVar14,&SPxStatusException::typeinfo,SPxException::~SPxException);
    }
    iVar12 = local_480[uVar32];
    iVar15 = piVar4[iVar12];
    iVar20 = local_5a0[iVar12];
    local_5a0[iVar12] = iVar20 + -1;
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 10;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems._24_5_ = 0;
    result_1.m_backend.data._M_elems[7]._1_3_ = 0;
    result_1.m_backend.data._M_elems._32_5_ = 0;
    result_1.m_backend.data._M_elems[9]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    result.m_backend.data._M_elems[0] = 1;
    result.m_backend.data._M_elems[1] = 0;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
              (&result_1.m_backend,(longlong *)&result,
               &pnVar28[(long)iVar15 + (long)iVar20 + -1].m_backend);
    pnVar28 = (pCVar25->diag).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(ulong *)((long)pnVar28[iVar12].m_backend.data._M_elems + 0x20) =
         CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,result_1.m_backend.data._M_elems._32_5_)
    ;
    puVar1 = (uint *)((long)pnVar28[iVar12].m_backend.data._M_elems + 0x10);
    *(undefined8 *)puVar1 = result_1.m_backend.data._M_elems._16_8_;
    *(ulong *)(puVar1 + 2) =
         CONCAT35(result_1.m_backend.data._M_elems[7]._1_3_,result_1.m_backend.data._M_elems._24_5_)
    ;
    *(undefined8 *)pnVar28[iVar12].m_backend.data._M_elems = result_1.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((long)pnVar28[iVar12].m_backend.data._M_elems + 8) =
         result_1.m_backend.data._M_elems._8_8_;
    pnVar28[iVar12].m_backend.exp = result_1.m_backend.exp;
    pnVar28[iVar12].m_backend.neg = result_1.m_backend.neg;
    pnVar28[iVar12].m_backend.fpclass = result_1.m_backend.fpclass;
    pnVar28[iVar12].m_backend.prec_elem = result_1.m_backend.prec_elem;
    iVar15 = piVar23[p_col];
    piVar23[p_col] = iVar15 + -1;
    lVar30 = (long)(iVar15 + -1 + piVar3[p_col]);
    pcVar27 = &local_568[lVar30 + 1].m_backend;
    piVar22 = local_570 + lVar30 + 1;
    do {
      piVar23 = piVar22 + -1;
      pcVar27 = pcVar27 + -1;
      piVar18 = piVar22 + -1;
      piVar22 = piVar23;
    } while (*piVar18 != iVar12);
    *piVar23 = local_570[lVar30];
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (pcVar27,&local_568[lVar30].m_backend);
    local_5b0 = pCVar25;
  }
  *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 8) =
       local_4c8.m_backend.data._M_elems._32_8_;
  *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 4) =
       local_4c8.m_backend.data._M_elems._16_8_;
  *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 6) =
       local_4c8.m_backend.data._M_elems._24_8_;
  *(undefined8 *)(this->maxabs).m_backend.data._M_elems = local_4c8.m_backend.data._M_elems._0_8_;
  *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 2) =
       local_4c8.m_backend.data._M_elems._8_8_;
  (local_5b0->maxabs).m_backend.exp = local_4c8.m_backend.exp;
  (local_5b0->maxabs).m_backend.neg = local_4c8.m_backend.neg;
  (local_5b0->maxabs).m_backend.fpclass = local_4c8.m_backend.fpclass;
  (local_5b0->maxabs).m_backend.prec_elem = local_4c8.m_backend.prec_elem;
  local_5b0->stat = OK;
  return;
}

Assistant:

void CLUFactor<R>::forestUpdate(int p_col, R* p_work, int num, int* nonz)
{
   int i, j, k, h, m, n;
   int ll, c, r, rowno;
   R x;

   R* lval;
   int* lidx;
   int* lbeg = l.start;

   R* cval;
   int* cidx = u.col.idx;
   int* cmax = u.col.max;
   int* clen = u.col.len;
   int* cbeg = u.col.start;

   R* rval = u.row.val.data();
   int* ridx = u.row.idx;
   int* rmax = u.row.max;
   int* rlen = u.row.len;
   int* rbeg = u.row.start;

   int* rperm = row.perm;
   int* rorig = row.orig;
   int* cperm = col.perm;
   int* corig = col.orig;

   R l_maxabs = maxabs;
   int dim = thedim;

   /*  Remove column p_col from U
    */
   j = cbeg[p_col];
   i = clen[p_col];
   nzCnt -= i;

   for(i += j - 1; i >= j; --i)
   {
      m = cidx[i];          // remove column p_col from row m
      k = rbeg[m];
      h = --(rlen[m]) + k;    // decrease length of row m

      while(ridx[k] != p_col)
         ++k;

      assert(k <= h);       // k is the position of p_col, h is last position

      ridx[k] = ridx[h];    // store last index at the position of p_col

      rval[k] = rval[h];
   }

   /*  Insert new VectorBase<R> column p_col thereby determining the highest permuted
    *       row index r.
    *
    *       Distinguish between optimized call (num > 0, nonz != 0) and
    *       non-optimized one.
    */
   assert(num);   // otherwise the assert( nonz != 0 ) below should fail

   if(num)
   {
      // Optimized call.
      assert(nonz != nullptr);

      clen[p_col] = 0;

      if(num > cmax[p_col])
         forestReMaxCol(p_col, num);

      cidx = u.col.idx;

      cval = u.col.val.data();

      k = cbeg[p_col];

      r = 0;

      for(j = 0; j < num; ++j)
      {
         i = nonz[j];
         x = p_work[i];
         p_work[i] = 0.0;

         if(isNotZero(x, R(_tolerances->epsilonUpdate())))
         {
            if(spxAbs(x) > l_maxabs)
               l_maxabs = spxAbs(x);

            /* insert to column file */
            assert(k - cbeg[p_col] < cmax[p_col]);

            cval[k] = x;

            cidx[k++] = i;

            /* insert to row file */
            if(rmax[i] <= rlen[i])
            {
               remaxRow(i, rlen[i] + 1);
               rval = u.row.val.data();
               ridx = u.row.idx;
            }

            h = rbeg[i] + (rlen[i])++;

            rval[h] = x;
            ridx[h] = p_col;

            /* check permuted row index */

            if(rperm[i] > r)
               r = rperm[i];
         }
      }

      nzCnt += (clen[p_col] = k - cbeg[p_col]);
   }
   else
   {
      // Non-optimized call: We have to access all elements of p_work.
      assert(nonz == nullptr);

      /*
       *      clen[col] = 0;
       *      reMaxCol(fac, col, dim);
       */
      cidx = u.col.idx;
      cval = u.col.val.data();
      k = cbeg[p_col];
      j = k + cmax[p_col];
      r = 0;

      for(i = 0; i < dim; ++i)
      {
         x = p_work[i];
         p_work[i] = 0.0;

         if(isNotZero(x, R(_tolerances->epsilonUpdate())))
         {
            if(spxAbs(x) > l_maxabs)
               l_maxabs = spxAbs(x);

            /* insert to column file */
            if(k >= j)
            {
               clen[p_col] = k - cbeg[p_col];
               forestReMaxCol(p_col, dim - i);
               cidx = u.col.idx;
               cval = u.col.val.data();
               k = cbeg[p_col];
               j = k + cmax[p_col];
               k += clen[p_col];
            }

            assert(k - cbeg[p_col] < cmax[p_col]);

            cval[k] = x;
            cidx[k++] = i;

            /* insert to row file */

            if(rmax[i] <= rlen[i])
            {
               remaxRow(i, rlen[i] + 1);
               rval = u.row.val.data();
               ridx = u.row.idx;
            }

            h = rbeg[i] + (rlen[i])++;

            rval[h] = x;
            ridx[h] = p_col;

            /* check permuted row index */

            if(rperm[i] > r)
               r = rperm[i];
         }
      }

      nzCnt += (clen[p_col] = k - cbeg[p_col]);

      if(cbeg[p_col] + cmax[p_col] == u.col.used)
      {
         u.col.used -= cmax[p_col];
         cmax[p_col] = clen[p_col];
         u.col.used += cmax[p_col];
      }
   }

   c = cperm[p_col];

   if(r > c)                          /* Forest Tomlin update */
   {
      /*      update permutations
       */
      j = rorig[c];

      // memmove is more efficient than a for loop
      // for ( i = c; i < r; ++i )
      //    rorig[i] = rorig[i + 1];
      memmove(&rorig[c], &rorig[c + 1], (unsigned int)(r - c) * sizeof(int));

      rorig[r] = j;

      for(i = c; i <= r; ++i)
         rperm[rorig[i]] = i;

      j = corig[c];

      // memmove is more efficient than a for loop
      // for ( i = c; i < r; ++i )
      //    corig[i] = corig[i + 1];
      memmove(&corig[c], &corig[c + 1], (unsigned int)(r - c) * sizeof(int));

      corig[r] = j;

      for(i = c; i <= r; ++i)
         cperm[corig[i]] = i;


      rowno = rorig[r];

      j = rbeg[rowno];

      i = rlen[rowno];

      nzCnt -= i;

      if(i < verySparseFactor * (dim - c))      // few nonzeros to be eliminated
      {
         /**
          *          The following assert is obviously violated if this method is called
          *          with nonzero==0.
          *
          *          @todo Use an extra member variable as a buffer for the heap instead of
          *                misusing nonz and num. The method enQueueMin() seems to
          *                sort the nonzeros or something, for which it only needs
          *                some empty VectorBase<R> of size num.
          */
         assert(nonz != nullptr);

         /*  move row r from U to p_work
          */
         num = 0;

         for(i += j - 1; i >= j; --i)
         {
            k = ridx[i];
            p_work[k] = rval[i];
            enQueueMin(nonz, &num, cperm[k]);
            m = --(clen[k]) + cbeg[k];

            for(h = m; cidx[h] != rowno; --h)
               ;

            cidx[h] = cidx[m];

            cval[h] = cval[m];
         }


         /*  Eliminate row r from U to L file
          */
         ll = makeLvec(r - c, rowno);

         lval = l.val.data();

         lidx = l.idx;

         assert((num == 0) || (nonz != nullptr));

         /* for(i = c; i < r; ++i)       */
         while(num)
         {
#ifndef NDEBUG
            // The numbers seem to be often 1e-100, is this ok ?

            for(i = 0; i < num; ++i)
               assert(p_work[corig[nonz[i]]] != 0.0);

#endif // NDEBUG
            i = deQueueMin(nonz, &num);

            if(i == r)
               break;

            k = corig[i];

            assert(p_work[k] != 0.0);

            n = rorig[i];

            x = p_work[k] * diag[n];

            lidx[ll] = n;

            lval[ll] = x;

            p_work[k] = 0.0;

            ll++;

            if(spxAbs(x) > l_maxabs)
               l_maxabs = spxAbs(x);

            j = rbeg[n];

            m = rlen[n] + j;

            for(; j < m; ++j)
            {
               int jj = ridx[j];
               R y = p_work[jj];

               if(y == 0)
                  enQueueMin(nonz, &num, cperm[jj]);

               y -= x * rval[j];

               p_work[jj] = y + ((y == 0) ? SOPLEX_FACTOR_MARKER : 0.0);
            }
         }

         if(lbeg[l.firstUnused - 1] == ll)
            (l.firstUnused)--;
         else
            lbeg[l.firstUnused] = ll;


         /*  Set diagonal value
          */
         if(i != r)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            throw SPxStatusException("XFORE01 The loaded matrix is singular");
         }

         k = corig[r];

         x = p_work[k];
         diag[rowno] = 1 / x;
         p_work[k] = 0.0;


         /*  make row large enough to fit all nonzeros.
          */

         if(rmax[rowno] < num)
         {
            rlen[rowno] = 0;
            remaxRow(rowno, num);
            rval = u.row.val.data();
            ridx = u.row.idx;
         }

         nzCnt += num;

         /*  Insert work to updated row thereby clearing work;
          */
         n = rbeg[rowno];

         for(i = 0; i < num; ++i)
         {
            j = corig[nonz[i]];
            x = p_work[j];

            // BH 2005-08-24: This if is very important. It may well happen that
            // during the elimination of row r a nonzero elements cancels out
            // and becomes zero. This would lead to an infinite loop in the
            // above elimination code, since the corresponding column index would
            // be enqueued for further elimination again and agian.

            if(x != 0.0)
            {
               if(spxAbs(x) > l_maxabs)
                  l_maxabs = spxAbs(x);

               ridx[n] = j;

               rval[n] = x;

               p_work[j] = 0.0;

               ++n;

               if(clen[j] >= cmax[j])
               {
                  forestReMaxCol(j, clen[j] + 1);
                  cidx = u.col.idx;
                  cval = u.col.val.data();
               }

               cval[cbeg[j] + clen[j]] = x;

               cidx[cbeg[j] + clen[j]++] = rowno;
            }
         }

         rlen[rowno] = n - rbeg[rowno];
      }
      else            /* few nonzeros to be eliminated        */
      {
         /*  move row r from U to p_work
          */
         for(i += j - 1; i >= j; --i)
         {
            k = ridx[i];
            p_work[k] = rval[i];
            m = --(clen[k]) + cbeg[k];

            for(h = m; cidx[h] != rowno; --h)
               ;

            cidx[h] = cidx[m];

            cval[h] = cval[m];
         }


         /*  Eliminate row r from U to L file
          */
         ll = makeLvec(r - c, rowno);

         lval = l.val.data();

         lidx = l.idx;

         for(i = c; i < r; ++i)
         {
            k = corig[i];

            if(p_work[k] != 0.0)
            {
               n = rorig[i];
               x = p_work[k] * diag[n];
               lidx[ll] = n;
               lval[ll] = x;
               p_work[k] = 0.0;
               ll++;

               if(spxAbs(x) > l_maxabs)
                  l_maxabs = spxAbs(x);

               j = rbeg[n];

               m = rlen[n] + j;

               for(; j < m; ++j)
                  p_work[ridx[j]] -= x * rval[j];
            }
         }

         if(lbeg[l.firstUnused - 1] == ll)
            (l.firstUnused)--;
         else
            lbeg[l.firstUnused] = ll;


         /*  Set diagonal value
          */
         k = corig[r];

         x = p_work[k];

         if(x == 0.0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            throw SPxStatusException("XFORE02 The loaded matrix is singular");
            //            return;
         }

         diag[rowno] = 1 / x;

         p_work[k] = 0.0;


         /*  count remaining nonzeros in work and make row large enough
          *  to fit them all.
          */
         n = 0;

         for(i = r + 1; i < dim; ++i)
            if(p_work[corig[i]] != 0.0)
               n++;

         if(rmax[rowno] < n)
         {
            rlen[rowno] = 0;
            remaxRow(rowno, n);
            rval = u.row.val.data();
            ridx = u.row.idx;
         }

         nzCnt += n;

         /*  Insert p_work to updated row thereby clearing p_work;
          */
         n = rbeg[rowno];

         for(i = r + 1; i < dim; ++i)
         {
            j = corig[i];
            x = p_work[j];

            if(x != 0.0)
            {
               if(spxAbs(x) > l_maxabs)
                  l_maxabs = spxAbs(x);

               ridx[n] = j;

               rval[n] = x;

               p_work[j] = 0.0;

               ++n;

               if(clen[j] >= cmax[j])
               {
                  forestReMaxCol(j, clen[j] + 1);
                  cidx = u.col.idx;
                  cval = u.col.val.data();
               }

               cval[cbeg[j] + clen[j]] = x;

               cidx[cbeg[j] + clen[j]++] = rowno;
            }
         }

         rlen[rowno] = n - rbeg[rowno];
      }
   }

   else if(r == c)
   {
      /*  Move diagonal element to diag.  Note, that it must be the last
       *  element, since it has just been inserted above.
       */
      rowno = rorig[r];
      i = rbeg[rowno] + --(rlen[rowno]);
      diag[rowno] = 1 / rval[i];

      for(j = i = --(clen[p_col]) + cbeg[p_col]; cidx[i] != rowno; --i)
         ;

      cidx[i] = cidx[j];

      cval[i] = cval[j];
   }
   else /* r < c */
   {
      this->stat = SLinSolver<R>::SINGULAR;
      throw SPxStatusException("XFORE03 The loaded matrix is singular");
      //      return;
   }

   maxabs = l_maxabs;

   assert(isConsistent());
   this->stat = SLinSolver<R>::OK;
}